

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O2

QByteArray * QTimeZonePrivate::ianaIdToWindowsId(QByteArray *__return_storage_ptr__,QByteArray *id)

{
  bool bVar1;
  WindowsData *this;
  long lVar2;
  long in_FS_OFFSET;
  iterator __begin2;
  QLatin1StringView local_c8;
  undefined1 local_b8 [32];
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  QBasicUtf8StringView<false> local_80;
  QByteArrayView local_70;
  ushort local_5a;
  QStringTokenizerBase<QLatin1String,_QChar> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_80.m_data = (id->d).ptr;
  local_80.m_size = (id->d).size;
  lVar2 = 0;
  do {
    if (lVar2 == 0x876) {
LAB_003ac3e2:
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char *)0x0;
      (__return_storage_ptr__->d).size = 0;
LAB_003ac3b2:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return __return_storage_ptr__;
    }
    local_58.m_haystack =
         QtTimeZoneCldr::ZoneData::id((ZoneData *)((long)&QtTimeZoneCldr::zoneDataTable + lVar2));
    local_58.super_QStringTokenizerBaseBase.m_sb.
    super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.super_QFlagsStorage<Qt::SplitBehaviorFlags>
    .i = (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x0;
    local_58.super_QStringTokenizerBaseBase.m_cs = CaseSensitive;
    local_58.m_needle.ucs = L' ';
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
    local_b8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_b8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStringTokenizerBase<QLatin1String,_QChar>::iterator::iterator((iterator *)local_b8,&local_58);
    while (local_b8[0x18] == true) {
      local_c8.m_size = local_b8._8_8_;
      local_c8.m_data = (char *)local_b8._16_8_;
      bVar1 = ::comparesEqual(&local_80,&local_c8);
      if (bVar1) {
        local_5a = ((ZoneData *)((long)&QtTimeZoneCldr::zoneDataTable + lVar2))->windowsIdKey;
        if (((ushort)(local_5a - 1) < 0x8b) &&
           ((&QtTimeZoneCldr::windowsDataTable)[(ulong)(local_5a - 1) * 6] == local_5a)) {
          local_70 = QtTimeZoneCldr::WindowsData::windowsId
                               ((WindowsData *)
                                (&QtTimeZoneCldr::windowsDataTable + (ulong)(local_5a - 1) * 6));
        }
        else {
          this = std::
                 __lower_bound<QtTimeZoneCldr::WindowsData_const*,unsigned_short,__gnu_cxx::__ops::_Iter_comp_val<bool(*)(QtTimeZoneCldr::WindowsData,short)noexcept>>
                           ((WindowsData *)&QtTimeZoneCldr::windowsDataTable,
                            (WindowsData *)&DAT_00533ed4,&local_5a,
                            (_Iter_comp_val<bool_(*)(QtTimeZoneCldr::WindowsData,_short)_noexcept>)
                            0x3aed13);
          if ((this == (WindowsData *)&DAT_00533ed4) || (this->windowsIdKey != local_5a))
          goto LAB_003ac3e2;
          local_70 = QtTimeZoneCldr::WindowsData::windowsId(this);
        }
        QByteArrayView::toByteArray(__return_storage_ptr__,&local_70);
        goto LAB_003ac3b2;
      }
      QStringTokenizerBase<QLatin1String,_QChar>::iterator::advance((iterator *)local_b8);
    }
    lVar2 = lVar2 + 6;
  } while( true );
}

Assistant:

QByteArray QTimeZonePrivate::ianaIdToWindowsId(const QByteArray &id)
{
    const auto idUtf8 = QUtf8StringView(id);

    for (const ZoneData &data : zoneDataTable) {
        for (auto l1 : data.ids()) {
            if (l1 == idUtf8)
                return toWindowsIdLiteral(data.windowsIdKey);
        }
    }
    // If the IANA ID is the default for any Windows ID, it has already shown up
    // as an ID for it in some territory; no need to search windowsDataTable[].
    return QByteArray();
}